

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbift3.cpp
# Opt level: O0

void CVmBifT3::get_named_arg_list(uint argc)

{
  vm_obj_id_t vVar1;
  int iVar2;
  int iVar3;
  int in_root_set;
  int iVar4;
  vm_val_t *this;
  CVmObject *this_00;
  vm_val_t str;
  uint len;
  uint ofs;
  int i;
  int n;
  uchar *t;
  vm_val_t *argp;
  vm_val_t *fp;
  int idx;
  CVmObjList *lst;
  vm_datatype_t in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffb8;
  CVmObjList *in_stack_ffffffffffffffd0;
  vm_val_t *in_stack_ffffffffffffffd8;
  vm_val_t *local_20;
  
  CVmBif::check_argc(0,0x2f66a3);
  this = CVmStack::push();
  vVar1 = CVmObjList::create(in_stack_ffffffffffffffb4,(size_t)this);
  vm_val_t::set_obj(this,vVar1);
  CVmStack::get(0);
  this_00 = vm_objp(0);
  CVmObjList::cons_clear
            ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_20 = CVmRun::get_frame_ptr();
  while (local_20 != (vm_val_t *)0x0) {
    in_stack_ffffffffffffffd0 =
         (CVmObjList *)
         CVmRun::get_named_args_from_frame
                   (in_stack_ffffffffffffffd8,(vm_val_t **)in_stack_ffffffffffffffd0);
    if (in_stack_ffffffffffffffd0 != (CVmObjList *)0x0) {
      iVar2 = ::osrp2(in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffffd0 =
           (CVmObjList *)
           ((long)&(in_stack_ffffffffffffffd0->super_CVmObjCollection).super_CVmObject.
                   _vptr_CVmObject + 2);
      in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + (iVar2 + -1);
      for (iVar3 = (iVar2 + -1) * 2; -1 < iVar3; iVar3 = iVar3 + -2) {
        in_root_set = ::osrp2((uchar *)((long)&(in_stack_ffffffffffffffd0->super_CVmObjCollection).
                                               super_CVmObject._vptr_CVmObject + (long)iVar3));
        iVar4 = ::osrp2((uchar *)((long)&(in_stack_ffffffffffffffd0->super_CVmObjCollection).
                                         super_CVmObject._vptr_CVmObject + (long)iVar3 + 2));
        iVar4 = iVar4 - in_root_set;
        vVar1 = CVmObjString::create
                          (in_root_set,in_stack_ffffffffffffffb8,
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffb0,vVar1);
        CVmObjList::cons_ensure_space
                  (in_stack_ffffffffffffffd0,CONCAT44(iVar2,iVar3),CONCAT44(in_root_set,iVar4));
        CVmObjList::cons_set_element
                  ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (size_t)this,(vm_val_t *)0x2f67f1);
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + -1;
      }
    }
    local_20 = CVmRun::get_enclosing_frame_ptr((vm_val_t *)0x2f6828);
  }
  CVmObjList::cons_set_len
            ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (size_t)this);
  CVmObjList::cons_uniquify((CVmObjList *)this_00);
  CVmBif::retval_pop();
  return;
}

Assistant:

void CVmBifT3::get_named_arg_list(VMG_ uint argc)
{
    /* check arguments */
    check_argc(vmg_ argc, 0);
    
    /* create the result list; we'll expand as necessary later */
    G_stk->push()->set_obj(CVmObjList::create(vmg_ FALSE, 10));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ G_stk->get(0)->val.obj);

    /* clear it out, since we're building it incrementally */
    lst->cons_clear();

    /* we haven't added any elements yet */
    int idx = 0;

    /* scan the stack and populate the name list from the tables we find */
    for (vm_val_t *fp = G_interpreter->get_frame_ptr() ; fp != 0 ;
         fp = G_interpreter->get_enclosing_frame_ptr(vmg_ fp))
    {
        /* look for a named argument table in this frame */
        vm_val_t *argp;
        const uchar *t = CVmRun::get_named_args_from_frame(vmg_ fp, &argp);
        if (t != 0)
        {
            /* get the number of table entries */
            int n = osrp2(t);
            t += 2;

            /* 
             *   Build the list.  The compiler generates the list in
             *   right-to-left order (the order of pushing the arguments).
             *   For readability, reverse this: generate the list left to
             *   right, so that it appears in the original source code order.
             */
            argp += n - 1;
            for (int i = (n-1)*2 ; i >= 0 ; i -= 2, --argp)
            {
                /* get this string's offset and figure its length */
                uint ofs = osrp2(t + i);
                uint len = osrp2(t + i + 2) - ofs;
                
                /* create a string from the name */
                vm_val_t str;
                str.set_obj(CVmObjString::create(
                    vmg_ FALSE, (const char *)t + ofs, len));

                /* add it to the list */
                lst->cons_ensure_space(vmg_ idx, 10);
                lst->cons_set_element(idx, &str);
                ++idx;
            }
        }
    }

    /* set the final list length */
    lst->cons_set_len(idx);

    /* keep only the unique elements */
    lst->cons_uniquify(vmg0_);

    /* return the results */
    retval_pop(vmg0_);
}